

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

void __thiscall
cmComputeLinkDepends::CheckWrongConfigItem(cmComputeLinkDepends *this,cmLinkItem *item)

{
  if (((this->OldLinkDirMode == true) && (item->Target != (cmTarget *)0x0)) &&
     (item->Target->IsImportedTarget == false)) {
    std::
    _Rb_tree<cmTarget_const*,cmTarget_const*,std::_Identity<cmTarget_const*>,std::less<cmTarget_const*>,std::allocator<cmTarget_const*>>
    ::_M_insert_unique<cmTarget_const*const&>
              ((_Rb_tree<cmTarget_const*,cmTarget_const*,std::_Identity<cmTarget_const*>,std::less<cmTarget_const*>,std::allocator<cmTarget_const*>>
                *)&this->OldWrongConfigItems,&item->Target);
    return;
  }
  return;
}

Assistant:

void cmComputeLinkDepends::CheckWrongConfigItem(cmLinkItem const& item)
{
  if(!this->OldLinkDirMode)
    {
    return;
    }

  // For CMake 2.4 bug-compatibility we need to consider the output
  // directories of targets linked in another configuration as link
  // directories.
  if(item.Target && !item.Target->IsImported())
    {
    this->OldWrongConfigItems.insert(item.Target);
    }
}